

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

bool __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::operator==
          (SmallVector<wasm::Literal,_1UL> *this,SmallVector<wasm::Literal,_1UL> *other)

{
  bool bVar1;
  Literal *other_00;
  Literal *this_00;
  ulong uVar2;
  
  if (this->usedFixed == other->usedFixed) {
    uVar2 = 0xffffffffffffffff;
    other_00 = (other->fixed)._M_elems;
    this_00 = (this->fixed)._M_elems;
    do {
      uVar2 = uVar2 + 1;
      if (this->usedFixed <= uVar2) {
        bVar1 = std::operator==(&this->flexible,&other->flexible);
        return bVar1;
      }
      bVar1 = Literal::operator!=(this_00,other_00);
      other_00 = other_00 + 1;
      this_00 = this_00 + 1;
    } while (!bVar1);
  }
  return false;
}

Assistant:

bool operator==(const SmallVector<T, N>& other) const {
    if (usedFixed != other.usedFixed) {
      return false;
    }
    for (size_t i = 0; i < usedFixed; i++) {
      if (fixed[i] != other.fixed[i]) {
        return false;
      }
    }
    return flexible == other.flexible;
  }